

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

void FIX::string_replace(string *oldValue,string *newValue,string *value)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)value,(ulong)oldValue);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)value,uVar1,(string *)oldValue->_M_string_length);
  }
  return;
}

Assistant:

void string_replace(const std::string &oldValue, const std::string &newValue, std::string &value) {
  for (std::string::size_type pos = value.find(oldValue); pos != std::string::npos; pos = value.find(oldValue, pos)) {
    value.replace(pos, oldValue.size(), newValue);
    pos += newValue.size();
  }
}